

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

SphericalCamera *
pbrt::SphericalCamera::Create
          (ParameterDictionary *parameters,CameraTransform *cameraTransform,Film *film,
          Medium *medium,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  undefined1 uVar2;
  Tuple2<pbrt::Point2,_int> def;
  Tuple2<pbrt::Point2,_int> this;
  size_type sVar3;
  reference pvVar4;
  SphericalCamera *pSVar5;
  FileLoc *in_RSI;
  string *in_RDI;
  Float FVar6;
  float fVar7;
  Mapping mapping;
  string m;
  vector<float,_std::allocator<float>_> sw;
  Bounds2f screen;
  Float frame;
  Float focaldistance;
  Float lensradius;
  CameraBaseParameters cameraBaseParameters;
  string *in_stack_fffffffffffffa48;
  ParameterDictionary *in_stack_fffffffffffffa50;
  undefined6 in_stack_fffffffffffffa58;
  undefined1 in_stack_fffffffffffffa5e;
  undefined1 in_stack_fffffffffffffa5f;
  Bounds2<float> *in_stack_fffffffffffffa60;
  vector<float,_std::allocator<float>_> *this_00;
  allocator<char> *in_stack_fffffffffffffa80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa90;
  ParameterDictionary *pPVar8;
  Medium *medium_00;
  Film *in_stack_fffffffffffffb00;
  CameraTransform *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  string local_4e8 [39];
  allocator<char> local_4c1;
  string local_4c0 [32];
  string local_4a0 [39];
  undefined1 local_479 [33];
  vector<float,_std::allocator<float>_> local_458;
  value_type local_43c;
  value_type local_438;
  value_type local_434;
  value_type local_430;
  Tuple2<pbrt::Point2,_int> local_42c;
  Tuple2<pbrt::Point2,_int> local_424;
  undefined1 local_419 [40];
  allocator<char> local_3f1;
  string local_3f0 [55];
  allocator<char> local_3b9;
  string local_3b8 [36];
  Float local_394;
  Medium local_390;
  ParameterDictionary local_388 [7];
  string *local_10;
  
  pPVar8 = local_388;
  local_10 = in_RDI;
  Film::Film((Film *)in_stack_fffffffffffffa50,(Film *)in_stack_fffffffffffffa48);
  medium_00 = &local_390;
  Medium::Medium((Medium *)in_stack_fffffffffffffa50,(Medium *)in_stack_fffffffffffffa48);
  CameraBaseParameters::CameraBaseParameters
            ((CameraBaseParameters *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
             in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,medium_00,pPVar8,in_RSI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,
             (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             in_stack_fffffffffffffa80);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,0.0);
  std::__cxx11::string::~string(local_3b8);
  std::allocator<char>::~allocator(&local_3b9);
  local_394 = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,
             (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             in_stack_fffffffffffffa80);
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,0.0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  pPVar8 = (ParameterDictionary *)local_419;
  local_3f0._32_4_ = FVar6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa90,
             (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             in_stack_fffffffffffffa80);
  def = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffa48);
  local_424.x = def.x;
  fVar7 = (float)local_424.x;
  local_424 = def;
  this = (Tuple2<pbrt::Point2,_int>)Film::FullResolution((Film *)in_stack_fffffffffffffa48);
  local_42c = this;
  FVar6 = ParameterDictionary::GetOneFloat(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48,0.0);
  std::__cxx11::string::~string((string *)(local_419 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_419);
  local_419._33_4_ = FVar6;
  Bounds2<float>::Bounds2(in_stack_fffffffffffffa60);
  if ((float)local_419._33_4_ <= 1.0) {
    local_43c = -1.0;
    local_434 = 1.0;
    local_438 = -1.0 / (float)local_419._33_4_;
    local_430 = 1.0 / (float)local_419._33_4_;
  }
  else {
    local_43c = -(float)local_419._33_4_;
    local_434 = (value_type)local_419._33_4_;
    local_438 = -1.0;
    local_430 = 1.0;
  }
  args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_479;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT44(fVar7,FVar6),(allocator<char> *)args);
  ParameterDictionary::GetFloatArray
            ((ParameterDictionary *)
             CONCAT17(in_stack_fffffffffffffa5f,
                      CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)),
             (string *)in_stack_fffffffffffffa50);
  std::__cxx11::string::~string((string *)(local_479 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_479);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty
                    ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffa60);
  if (!bVar1) {
    if ((*(byte *)(Options + 0xd) & 1) == 0) {
      sVar3 = std::vector<float,_std::allocator<float>_>::size(&local_458);
      if (sVar3 == 4) {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,0);
        local_43c = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,1);
        local_434 = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,2);
        local_438 = *pvVar4;
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&local_458,3);
        local_430 = *pvVar4;
      }
      else {
        Error((FileLoc *)in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48);
      }
    }
    else {
      Warning<>((char *)args);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT44(fVar7,FVar6),(allocator<char> *)args);
  this_00 = (vector<float,_std::allocator<float>_> *)&stack0xfffffffffffffb17;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (char *)CONCAT44(fVar7,FVar6),(allocator<char> *)args);
  ParameterDictionary::GetOneString(pPVar8,local_10,(string *)def);
  std::__cxx11::string::~string(local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffb17);
  std::__cxx11::string::~string(local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  uVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48);
  if ((!(bool)uVar2) &&
     (in_stack_fffffffffffffa5e =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           in_stack_fffffffffffffa50,(char *)in_stack_fffffffffffffa48),
     !(bool)in_stack_fffffffffffffa5e)) {
    ErrorExit<std::__cxx11::string&>((FileLoc *)this,(char *)CONCAT44(fVar7,FVar6),args);
  }
  pSVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::SphericalCamera,pbrt::CameraBaseParameters&,pbrt::SphericalCamera::Mapping&>
                     ((polymorphic_allocator<std::byte> *)this_00,
                      (CameraBaseParameters *)
                      CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffa5e,in_stack_fffffffffffffa58)),
                      (Mapping *)in_stack_fffffffffffffa50);
  std::__cxx11::string::~string(local_4a0);
  std::vector<float,_std::allocator<float>_>::~vector(this_00);
  return pSVar5;
}

Assistant:

SphericalCamera *SphericalCamera::Create(const ParameterDictionary &parameters,
                                         const CameraTransform &cameraTransform,
                                         Film film, Medium medium, const FileLoc *loc,
                                         Allocator alloc) {
    CameraBaseParameters cameraBaseParameters(cameraTransform, film, medium, parameters,
                                              loc);

    Float lensradius = parameters.GetOneFloat("lensradius", 0.f);
    Float focaldistance = parameters.GetOneFloat("focaldistance", 1e30f);
    Float frame =
        parameters.GetOneFloat("frameaspectratio", Float(film.FullResolution().x) /
                                                       Float(film.FullResolution().y));
    Bounds2f screen;
    if (frame > 1.f) {
        screen.pMin.x = -frame;
        screen.pMax.x = frame;
        screen.pMin.y = -1.f;
        screen.pMax.y = 1.f;
    } else {
        screen.pMin.x = -1.f;
        screen.pMax.x = 1.f;
        screen.pMin.y = -1.f / frame;
        screen.pMax.y = 1.f / frame;
    }
    std::vector<Float> sw = parameters.GetFloatArray("screenwindow");
    if (!sw.empty()) {
        if (Options->fullscreen) {
                Warning("\"screenwindow\" is ignored in fullscreen mode");
        } else {
            if (sw.size() == 4) {
                screen.pMin.x = sw[0];
                screen.pMax.x = sw[1];
                screen.pMin.y = sw[2];
                screen.pMax.y = sw[3];
            } else {
                Error(loc, "\"screenwindow\" should have four values");
            }
        }
    }
    (void)lensradius;     // don't need this
    (void)focaldistance;  // don't need this

    std::string m = parameters.GetOneString("mapping", "equalarea");
    Mapping mapping;
    if (m == "equalarea")
        mapping = EqualArea;
    else if (m == "equirectangular")
        mapping = EquiRectangular;
    else
        ErrorExit(loc,
                  "%s: unknown mapping for spherical camera. (Must be "
                  "\"equalarea\" or \"equirectangular\".)",
                  m);

    return alloc.new_object<SphericalCamera>(cameraBaseParameters, mapping);
}